

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poolresourcetester.h
# Opt level: O0

void PoolResourceTester::CheckAllDataAccountedFor<144ul,8ul>(PoolResource<144UL,_8UL> *resource)

{
  bool bVar1;
  size_type sVar2;
  const_reference ppLVar3;
  pointer pPVar4;
  reference pPVar5;
  long in_RDI;
  long in_FS_OFFSET;
  PtrAndBytes *free_block;
  vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  *__range2_1;
  size_t chunk_size_remaining;
  uintptr_t chunk_ptr_remaining;
  list<std::byte_*,_std::allocator<std::byte_*>_> *__range2;
  size_t freelist_idx;
  iterator __end2;
  iterator __begin2;
  iterator chunk_it;
  byte *ptr_1;
  const_iterator __end0;
  const_iterator __begin0;
  vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> chunks;
  long num_available_bytes;
  ListNode *ptr;
  size_t bytes;
  vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
  free_blocks;
  PoolResource<144UL,_8UL> *in_stack_fffffffffffffeb8;
  list<std::byte_*,_std::allocator<std::byte_*>_> *in_stack_fffffffffffffec0;
  array<PoolResource<144UL,_8UL>::ListNode_*,_19UL> *in_stack_fffffffffffffec8;
  vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *this;
  __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
  in_stack_fffffffffffffed0;
  __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
  __first;
  size_t local_f8;
  uintptr_t local_f0;
  ulong local_b0;
  PtrAndBytes local_50;
  long local_38;
  value_type local_30;
  long local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  vector((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
          *)in_stack_fffffffffffffeb8);
  local_b0 = 0;
  while( true ) {
    sVar2 = std::array<PoolResource<144UL,_8UL>::ListNode_*,_19UL>::size
                      ((array<PoolResource<144UL,_8UL>::ListNode_*,_19UL> *)
                       in_stack_fffffffffffffeb8);
    if (sVar2 <= local_b0) break;
    local_28 = local_b0 << 3;
    ppLVar3 = std::array<PoolResource<144UL,_8UL>::ListNode_*,_19UL>::operator[]
                        (in_stack_fffffffffffffec8,(size_type)in_stack_fffffffffffffec0);
    for (local_30 = *ppLVar3; local_30 != (value_type)0x0; local_30 = local_30->m_next) {
      std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
      emplace_back<PoolResource<144ul,8ul>::ListNode*&,unsigned_long&>
                ((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
                  *)in_stack_fffffffffffffed8._M_current,
                 (ListNode **)in_stack_fffffffffffffed0._M_current,
                 (unsigned_long *)in_stack_fffffffffffffec8);
    }
    local_b0 = local_b0 + 1;
  }
  local_38 = *(long *)(in_RDI + 0xc0) - *(long *)(in_RDI + 0xb8);
  if (0 < local_38) {
    std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
    emplace_back<std::byte*const&,long&>
              ((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
                *)in_stack_fffffffffffffed8._M_current,(byte **)in_stack_fffffffffffffed0._M_current
               ,(long *)in_stack_fffffffffffffec8);
  }
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  vector((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
          *)in_stack_fffffffffffffeb8);
  std::__cxx11::list<std::byte_*,_std::allocator<std::byte_*>_>::begin(in_stack_fffffffffffffec0);
  std::__cxx11::list<std::byte_*,_std::allocator<std::byte_*>_>::end(in_stack_fffffffffffffec0);
  while( true ) {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffec8,(_Self *)in_stack_fffffffffffffec0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::_List_const_iterator<std::byte_*>::operator*
              ((_List_const_iterator<std::byte_*> *)in_stack_fffffffffffffeb8);
    PoolResource<144UL,_8UL>::ChunkSizeBytes(in_stack_fffffffffffffeb8);
    std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>::
    emplace_back<std::byte_const*&,unsigned_long>
              ((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
                *)in_stack_fffffffffffffed8._M_current,(byte **)in_stack_fffffffffffffed0._M_current
               ,(unsigned_long *)in_stack_fffffffffffffec8);
    std::_List_const_iterator<std::byte_*>::operator++
              ((_List_const_iterator<std::byte_*> *)in_stack_fffffffffffffeb8);
  }
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  begin((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *
        )in_stack_fffffffffffffec0);
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  end((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *)
      in_stack_fffffffffffffec0);
  std::
  sort<__gnu_cxx::__normal_iterator<PoolResourceTester::PtrAndBytes*,std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>>>
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  __first._M_current = &local_50;
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  begin((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *
        )in_stack_fffffffffffffec0);
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  end((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *)
      in_stack_fffffffffffffec0);
  std::
  sort<__gnu_cxx::__normal_iterator<PoolResourceTester::PtrAndBytes*,std::vector<PoolResourceTester::PtrAndBytes,std::allocator<PoolResourceTester::PtrAndBytes>>>>
            (__first,in_stack_fffffffffffffed0);
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  begin((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *
        )in_stack_fffffffffffffec0);
  pPVar4 = __gnu_cxx::
           __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
           ::operator->((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                         *)in_stack_fffffffffffffeb8);
  local_f0 = pPVar4->ptr;
  pPVar4 = __gnu_cxx::
           __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
           ::operator->((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                         *)in_stack_fffffffffffffeb8);
  local_f8 = pPVar4->size;
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  begin((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *
        )in_stack_fffffffffffffec0);
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  end((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *)
      in_stack_fffffffffffffec0);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                      ((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                        *)in_stack_fffffffffffffec8,
                       (__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                        *)in_stack_fffffffffffffec0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pPVar5 = __gnu_cxx::
             __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
             ::operator*((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                          *)in_stack_fffffffffffffeb8);
    if (local_f8 == 0) {
      std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
      ::end((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
             *)in_stack_fffffffffffffec0);
      bVar1 = __gnu_cxx::
              operator==<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                        ((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                          *)in_stack_fffffffffffffec8,
                         (__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                          *)in_stack_fffffffffffffec0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("chunk_it != chunks.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                      ,0x6d,
                      "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 144UL, ALIGN_BYTES = 8UL]"
                     );
      }
      __gnu_cxx::
      __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
      ::operator++((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                    *)in_stack_fffffffffffffeb8);
      std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
      ::end((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
             *)in_stack_fffffffffffffec0);
      bVar1 = __gnu_cxx::
              operator==<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                        ((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                          *)in_stack_fffffffffffffec8,
                         (__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                          *)in_stack_fffffffffffffec0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("chunk_it != chunks.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                      ,0x6f,
                      "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 144UL, ALIGN_BYTES = 8UL]"
                     );
      }
      pPVar4 = __gnu_cxx::
               __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
               ::operator->((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                             *)in_stack_fffffffffffffeb8);
      local_f0 = pPVar4->ptr;
      pPVar4 = __gnu_cxx::
               __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
               ::operator->((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                             *)in_stack_fffffffffffffeb8);
      local_f8 = pPVar4->size;
    }
    if (pPVar5->ptr != local_f0) {
      __assert_fail("free_block.ptr == chunk_ptr_remaining",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                    ,0x73,
                    "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 144UL, ALIGN_BYTES = 8UL]"
                   );
    }
    if (local_f8 < pPVar5->size) {
      __assert_fail("free_block.size <= chunk_size_remaining",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                    ,0x74,
                    "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 144UL, ALIGN_BYTES = 8UL]"
                   );
    }
    if ((pPVar5->ptr & 7) != 0) {
      __assert_fail("(free_block.ptr & (resource.ELEM_ALIGN_BYTES - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                    ,0x75,
                    "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 144UL, ALIGN_BYTES = 8UL]"
                   );
    }
    local_f0 = pPVar5->size + local_f0;
    local_f8 = local_f8 - pPVar5->size;
    __gnu_cxx::
    __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
    ::operator++((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                  *)in_stack_fffffffffffffeb8);
  }
  pPVar4 = __gnu_cxx::
           __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
           ::operator->((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                         *)in_stack_fffffffffffffeb8);
  this = (vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
          *)pPVar4->ptr;
  pPVar4 = __gnu_cxx::
           __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
           ::operator->((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                         *)in_stack_fffffffffffffeb8);
  if (local_f0 !=
      (long)&(this->
             super__Vector_base<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>
             )._M_impl.super__Vector_impl_data._M_start + pPVar4->size) {
    __assert_fail("chunk_ptr_remaining == chunk_it->ptr + chunk_it->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                  ,0x7a,
                  "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 144UL, ALIGN_BYTES = 8UL]"
                 );
  }
  __gnu_cxx::
  __normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
  ::operator++((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                *)in_stack_fffffffffffffeb8);
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  end((vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_> *)
      in_stack_fffffffffffffec0);
  bVar1 = __gnu_cxx::
          operator==<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                    ((__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                      *)this,(__normal_iterator<PoolResourceTester::PtrAndBytes_*,_std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>_>
                              *)in_stack_fffffffffffffec0);
  if (!bVar1) {
    __assert_fail("chunk_it == chunks.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                  ,0x7c,
                  "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 144UL, ALIGN_BYTES = 8UL]"
                 );
  }
  if (local_f8 != 0) {
    __assert_fail("chunk_size_remaining == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/poolresourcetester.h"
                  ,0x7d,
                  "static void PoolResourceTester::CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES> &) [MAX_BLOCK_SIZE_BYTES = 144UL, ALIGN_BYTES = 8UL]"
                 );
  }
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  ~vector(this);
  std::vector<PoolResourceTester::PtrAndBytes,_std::allocator<PoolResourceTester::PtrAndBytes>_>::
  ~vector(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckAllDataAccountedFor(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES>& resource)
    {
        // collect all free blocks by iterating all freelists
        std::vector<PtrAndBytes> free_blocks;
        for (std::size_t freelist_idx = 0; freelist_idx < resource.m_free_lists.size(); ++freelist_idx) {
            std::size_t bytes = freelist_idx * resource.ELEM_ALIGN_BYTES;
            auto* ptr = resource.m_free_lists[freelist_idx];
            while (ptr != nullptr) {
                free_blocks.emplace_back(ptr, bytes);
                ptr = ptr->m_next;
            }
        }
        // also add whatever has not yet been used for blocks
        auto num_available_bytes = resource.m_available_memory_end - resource.m_available_memory_it;
        if (num_available_bytes > 0) {
            free_blocks.emplace_back(resource.m_available_memory_it, num_available_bytes);
        }

        // collect all chunks
        std::vector<PtrAndBytes> chunks;
        for (const std::byte* ptr : resource.m_allocated_chunks) {
            chunks.emplace_back(ptr, resource.ChunkSizeBytes());
        }

        // now we have all the data from all freelists on the one hand side, and all chunks on the other hand side.
        // To check if all of them match, sort by address and iterate.
        std::sort(free_blocks.begin(), free_blocks.end());
        std::sort(chunks.begin(), chunks.end());

        auto chunk_it = chunks.begin();
        auto chunk_ptr_remaining = chunk_it->ptr;
        auto chunk_size_remaining = chunk_it->size;
        for (const auto& free_block : free_blocks) {
            if (chunk_size_remaining == 0) {
                assert(chunk_it != chunks.end());
                ++chunk_it;
                assert(chunk_it != chunks.end());
                chunk_ptr_remaining = chunk_it->ptr;
                chunk_size_remaining = chunk_it->size;
            }
            assert(free_block.ptr == chunk_ptr_remaining);                   // ensure addresses match
            assert(free_block.size <= chunk_size_remaining);                 // ensure no overflow
            assert((free_block.ptr & (resource.ELEM_ALIGN_BYTES - 1)) == 0); // ensure correct alignment
            chunk_ptr_remaining += free_block.size;
            chunk_size_remaining -= free_block.size;
        }
        // ensure we are at the end of the chunks
        assert(chunk_ptr_remaining == chunk_it->ptr + chunk_it->size);
        ++chunk_it;
        assert(chunk_it == chunks.end());
        assert(chunk_size_remaining == 0);
    }